

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

int ClipperLib::PointInPolygon(IntPoint *pt,OutPt *op)

{
  long lVar1;
  long lVar2;
  OutPt *pOVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  OutPt *pOVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  
  lVar1 = pt->X;
  lVar2 = pt->Y;
  iVar9 = 0;
  iVar8 = 0;
  pOVar10 = op;
  do {
    pOVar3 = pOVar10->Next;
    lVar4 = (pOVar3->Pt).Y;
    if (lVar4 == lVar2) {
      lVar5 = (pOVar3->Pt).X;
      if (lVar5 == lVar1) {
        return -1;
      }
      if (((pOVar10->Pt).Y == lVar2) && (lVar1 <= (pOVar10->Pt).X != lVar1 < lVar5)) {
        return -1;
      }
    }
    lVar5 = (pOVar10->Pt).Y;
    if (lVar2 <= lVar4 == lVar5 < lVar2) {
      lVar6 = (pOVar10->Pt).X;
      lVar7 = (pOVar3->Pt).X;
      if (lVar6 < lVar1) {
        lVar12 = lVar7 - lVar1;
        if (lVar12 != 0 && lVar1 <= lVar7) {
LAB_002d7eae:
          dVar13 = (double)(lVar4 - lVar2) * (double)(lVar6 - lVar1) -
                   (double)(lVar5 - lVar2) * (double)lVar12;
          if (((dVar13 != 0.0) || (NAN(dVar13))) &&
             (iVar11 = 1 - iVar8, iVar8 = iVar9, lVar4 <= lVar5 != 0.0 < dVar13)) {
            iVar8 = iVar11;
            iVar9 = iVar11;
          }
          if ((dVar13 == 0.0) && (!NAN(dVar13))) {
            return -1;
          }
        }
      }
      else {
        lVar12 = lVar7 - lVar1;
        if (lVar12 == 0 || lVar7 < lVar1) goto LAB_002d7eae;
        iVar8 = 1 - iVar8;
        iVar9 = iVar8;
      }
    }
    pOVar10 = pOVar3;
    if (pOVar3 == op) {
      return iVar8;
    }
  } while( true );
}

Assistant:

int PointInPolygon (const IntPoint &pt, OutPt *op)
{
  //returns 0 if false, +1 if true, -1 if pt ON polygon boundary
  int result = 0;
  OutPt* startOp = op;
  for(;;)
  {
    if (op->Next->Pt.Y == pt.Y)
    {
        if ((op->Next->Pt.X == pt.X) || (op->Pt.Y == pt.Y && 
          ((op->Next->Pt.X > pt.X) == (op->Pt.X < pt.X)))) return -1;
    }
    if ((op->Pt.Y < pt.Y) != (op->Next->Pt.Y < pt.Y))
    {
      if (op->Pt.X >= pt.X)
      {
        if (op->Next->Pt.X > pt.X) result = 1 - result;
        else
        {
          double d = (double)(op->Pt.X - pt.X) * (op->Next->Pt.Y - pt.Y) - 
            (double)(op->Next->Pt.X - pt.X) * (op->Pt.Y - pt.Y);
          if (!d) return -1;
          if ((d > 0) == (op->Next->Pt.Y > op->Pt.Y)) result = 1 - result;
        }
      } else
      {
        if (op->Next->Pt.X > pt.X)
        {
          double d = (double)(op->Pt.X - pt.X) * (op->Next->Pt.Y - pt.Y) - 
            (double)(op->Next->Pt.X - pt.X) * (op->Pt.Y - pt.Y);
          if (!d) return -1;
          if ((d > 0) == (op->Next->Pt.Y > op->Pt.Y)) result = 1 - result;
        }
      }
    } 
    op = op->Next;
    if (startOp == op) break;
  } 
  return result;
}